

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngerror.c
# Opt level: O1

void png_free_jmpbuf(png_structrp png_ptr)

{
  png_structrp ptr;
  int iVar1;
  jmp_buf_conflict free_jmp_buf;
  __jmp_buf_tag _Stack_e8;
  
  if (png_ptr != (png_structrp)0x0) {
    ptr = (png_structrp)png_ptr->jmp_buf_ptr;
    if (((ptr != (png_structrp)0x0) && (ptr != png_ptr)) && (png_ptr->jmp_buf_size != 0)) {
      iVar1 = _setjmp(&_Stack_e8);
      if (iVar1 == 0) {
        png_ptr->jmp_buf_ptr = (jmp_buf_conflict *)&_Stack_e8;
        png_ptr->jmp_buf_size = 0;
        png_ptr->longjmp_fn = longjmp;
        png_free(png_ptr,ptr);
      }
    }
    png_ptr->longjmp_fn = (png_longjmp_ptr)0x0;
    png_ptr->jmp_buf_ptr = (jmp_buf_conflict *)0x0;
    png_ptr->jmp_buf_size = 0;
  }
  return;
}

Assistant:

void /* PRIVATE */
png_free_jmpbuf(png_structrp png_ptr)
{
   if (png_ptr != NULL)
   {
      jmp_buf *jb = png_ptr->jmp_buf_ptr;

      /* A size of 0 is used to indicate a local, stack, allocation of the
       * pointer; used here and in png.c
       */
      if (jb != NULL && png_ptr->jmp_buf_size > 0)
      {

         /* This stuff is so that a failure to free the error control structure
          * does not leave libpng in a state with no valid error handling: the
          * free always succeeds, if there is an error it gets ignored.
          */
         if (jb != &png_ptr->jmp_buf_local)
         {
            /* Make an internal, libpng, jmp_buf to return here */
            jmp_buf free_jmp_buf;

            if (!setjmp(free_jmp_buf))
            {
               png_ptr->jmp_buf_ptr = &free_jmp_buf; /* come back here */
               png_ptr->jmp_buf_size = 0; /* stack allocation */
               png_ptr->longjmp_fn = longjmp;
               png_free(png_ptr, jb); /* Return to setjmp on error */
            }
         }
      }

      /* *Always* cancel everything out: */
      png_ptr->jmp_buf_size = 0;
      png_ptr->jmp_buf_ptr = NULL;
      png_ptr->longjmp_fn = 0;
   }
}